

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

CURLcode curl_easy_perform(Curl_easy *data)

{
  uint uVar1;
  CURLMcode CVar2;
  Curl_multi *multi;
  time_t tVar3;
  CURLMsg *pCVar4;
  CURLcode CVar5;
  int timeout_ms;
  uint uVar6;
  timeval older;
  timeval newer;
  int still_running;
  sigpipe_ignore pipe_st;
  int local_d8;
  int local_d4;
  sigpipe_ignore local_d0;
  
  if (data == (Curl_easy *)0x0) {
    CVar5 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else if (data->multi == (Curl_multi *)0x0) {
    multi = data->multi_easy;
    if (multi == (Curl_multi *)0x0) {
      multi = Curl_multi_handle(1,3);
      if (multi == (Curl_multi *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      data->multi_easy = multi;
    }
    uVar6 = 0;
    curl_multi_setopt(multi,CURLMOPT_MAXCONNECTS,(data->set).maxconnects);
    CVar2 = curl_multi_add_handle(multi,data);
    if (CVar2 == CURLM_OK) {
      uVar1._0_1_ = (data->set).no_signal;
      uVar1._1_1_ = (data->set).global_dns_cache;
      uVar1._2_1_ = (data->set).tcp_nodelay;
      uVar1._3_1_ = (data->set).ignorecl;
      sigpipe_ignore((Curl_easy *)(ulong)uVar1,&local_d0);
      data->multi = multi;
      do {
        local_d4 = 0;
        older = curlx_tvnow();
        CVar2 = curl_multi_wait(multi,(curl_waitfd *)0x0,0,1000,&local_d8);
        if (CVar2 != CURLM_OK) break;
        uVar1 = 0;
        if (local_d8 == 0) {
          newer = curlx_tvnow();
          tVar3 = curlx_tvdiff(newer,older);
          if ((tVar3 < 0xb) && (uVar1 = uVar6 + 1, 1 < (int)uVar6)) {
            timeout_ms = 1 << ((byte)uVar6 & 0x1f);
            if (8 < uVar6) {
              timeout_ms = 1000;
            }
            Curl_wait_ms(timeout_ms);
          }
        }
        uVar6 = uVar1;
        CVar2 = curl_multi_perform(multi,&local_d4);
        if ((local_d4 == 0 && CVar2 == CURLM_OK) &&
           (pCVar4 = curl_multi_info_read(multi,&local_d8), pCVar4 != (CURLMsg *)0x0)) {
          CVar5 = (pCVar4->data).result;
          goto LAB_00500d31;
        }
      } while (CVar2 == CURLM_OK);
      CVar5 = (uint)(CVar2 != CURLM_OUT_OF_MEMORY) * 0x10 + CURLE_OUT_OF_MEMORY;
LAB_00500d31:
      curl_multi_remove_handle(multi,data);
      if (local_d0.no_signal == false) {
        sigaction(0xd,(sigaction *)&local_d0,(sigaction *)0x0);
      }
    }
    else {
      curl_multi_cleanup(multi);
      CVar5 = CURLE_FAILED_INIT;
      if (CVar2 == CURLM_OUT_OF_MEMORY) {
        CVar5 = CURLE_OUT_OF_MEMORY;
      }
    }
  }
  else {
    Curl_failf(data,"easy handle already used in multi handle");
    CVar5 = CURLE_FAILED_INIT;
  }
  return CVar5;
}

Assistant:

static CURLcode easy_perform(struct Curl_easy *data, bool events)
{
  struct Curl_multi *multi;
  CURLMcode mcode;
  CURLcode result = CURLE_OK;
  SIGPIPE_VARIABLE(pipe_st);

  if(!data)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(data->multi) {
    failf(data, "easy handle already used in multi handle");
    return CURLE_FAILED_INIT;
  }

  if(data->multi_easy)
    multi = data->multi_easy;
  else {
    /* this multi handle will only ever have a single easy handled attached
       to it, so make it use minimal hashes */
    multi = Curl_multi_handle(1, 3);
    if(!multi)
      return CURLE_OUT_OF_MEMORY;
    data->multi_easy = multi;
  }

  /* Copy the MAXCONNECTS option to the multi handle */
  curl_multi_setopt(multi, CURLMOPT_MAXCONNECTS, data->set.maxconnects);

  mcode = curl_multi_add_handle(multi, data);
  if(mcode) {
    curl_multi_cleanup(multi);
    if(mcode == CURLM_OUT_OF_MEMORY)
      return CURLE_OUT_OF_MEMORY;
    return CURLE_FAILED_INIT;
  }

  sigpipe_ignore(data, &pipe_st);

  /* assign this after curl_multi_add_handle() since that function checks for
     it and rejects this handle otherwise */
  data->multi = multi;

  /* run the transfer */
  result = events ? easy_events(multi) : easy_transfer(multi);

  /* ignoring the return code isn't nice, but atm we can't really handle
     a failure here, room for future improvement! */
  (void)curl_multi_remove_handle(multi, data);

  sigpipe_restore(&pipe_st);

  /* The multi handle is kept alive, owned by the easy handle */
  return result;
}